

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O3

void __thiscall
QSyntaxHighlighterPrivate::reformatBlock(QSyntaxHighlighterPrivate *this,QTextBlock *block)

{
  long *plVar1;
  int iVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  (this->currentBlock).p = block->p;
  (this->currentBlock).n = block->n;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_48);
  iVar2 = QTextBlock::length(block);
  QList<QTextCharFormat>::fill(&this->formatChanges,(parameter_type)&local_48,(long)(iVar2 + -1));
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextBlock::text(&local_48,block);
  (**(code **)(*plVar1 + 0x60))(plVar1,&local_48);
  if ((QTextFormatPrivate *)local_48.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_48.d.d = *(int *)local_48.d.d + -1;
    UNLOCK();
    if (*(int *)local_48.d.d == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  applyFormatChanges(this);
  (this->currentBlock).p = (QTextDocumentPrivate *)0x0;
  (this->currentBlock).n = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighterPrivate::reformatBlock(const QTextBlock &block)
{
    Q_Q(QSyntaxHighlighter);

    Q_ASSERT_X(!currentBlock.isValid(), "QSyntaxHighlighter::reformatBlock()", "reFormatBlock() called recursively");

    currentBlock = block;

    formatChanges.fill(QTextCharFormat(), block.length() - 1);
    q->highlightBlock(block.text());
    applyFormatChanges();

    currentBlock = QTextBlock();
}